

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metaDemuxer.cpp
# Opt level: O0

string * METADemuxer::mplsTrackToSSIFName
                   (string *__return_storage_ptr__,string *mplsFileName,string *mplsNum)

{
  char cVar1;
  bool bVar2;
  char *__s;
  allocator<char> local_239;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_238;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_218;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f8;
  allocator<char> local_1d1;
  undefined1 local_1d0 [8];
  string ssifExt;
  undefined1 local_190 [8];
  string mplsExt;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_168;
  allocator<char> local_141;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_140;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_120;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_100;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  undefined4 local_7c;
  long local_78;
  size_t tmp;
  string local_60;
  undefined1 local_40 [8];
  string path;
  string *mplsNum_local;
  string *mplsFileName_local;
  
  path.field_2._8_8_ = mplsNum;
  extractFilePath(&local_60,mplsFileName);
  toNativeSeparators((string *)local_40,&local_60);
  std::__cxx11::string::~string((string *)&local_60);
  cVar1 = getDirSeparator();
  local_78 = std::__cxx11::string::find_last_of((char)local_40,(ulong)(uint)(int)cVar1);
  if (local_78 == -1) {
    std::__cxx11::string::string((string *)__return_storage_ptr__);
    local_7c = 1;
  }
  else {
    std::__cxx11::string::substr((ulong)&local_120,(ulong)local_40);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_140,"STREAM",&local_141);
    std::operator+(&local_100,&local_120,&local_140);
    cVar1 = getDirSeparator();
    std::operator+(&local_e0,&local_100,cVar1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_168,"SSIF",(allocator<char> *)(mplsExt.field_2._M_local_buf + 0xf));
    std::operator+(&local_c0,&local_e0,&local_168);
    cVar1 = getDirSeparator();
    std::operator+(&local_a0,&local_c0,cVar1);
    std::__cxx11::string::operator=((string *)local_40,(string *)&local_a0);
    std::__cxx11::string::~string((string *)&local_a0);
    std::__cxx11::string::~string((string *)&local_c0);
    std::__cxx11::string::~string((string *)&local_168);
    std::allocator<char>::~allocator((allocator<char> *)(mplsExt.field_2._M_local_buf + 0xf));
    std::__cxx11::string::~string((string *)&local_e0);
    std::__cxx11::string::~string((string *)&local_100);
    std::__cxx11::string::~string((string *)&local_140);
    std::allocator<char>::~allocator(&local_141);
    std::__cxx11::string::~string((string *)&local_120);
    extractFileExt((string *)((long)&ssifExt.field_2 + 8),mplsFileName);
    strToLowerCase((string *)local_190,(string *)((long)&ssifExt.field_2 + 8));
    std::__cxx11::string::~string((string *)(ssifExt.field_2._M_local_buf + 8));
    bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_190,"mpls");
    __s = "sif";
    if (bVar2) {
      __s = "ssif";
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)local_1d0,__s,&local_1d1);
    std::allocator<char>::~allocator(&local_1d1);
    std::operator+(&local_218,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   path.field_2._8_8_);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_238,".",&local_239);
    std::operator+(&local_1f8,&local_218,&local_238);
    std::operator+(__return_storage_ptr__,&local_1f8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1d0);
    std::__cxx11::string::~string((string *)&local_1f8);
    std::__cxx11::string::~string((string *)&local_238);
    std::allocator<char>::~allocator(&local_239);
    std::__cxx11::string::~string((string *)&local_218);
    local_7c = 1;
    std::__cxx11::string::~string((string *)local_1d0);
    std::__cxx11::string::~string((string *)local_190);
  }
  std::__cxx11::string::~string((string *)local_40);
  return __return_storage_ptr__;
}

Assistant:

std::string METADemuxer::mplsTrackToSSIFName(const std::string& mplsFileName, const std::string& mplsNum)
{
    string path = toNativeSeparators(extractFilePath(mplsFileName));
    const size_t tmp = path.find_last_of(getDirSeparator());
    if (tmp == string::npos)
        return {};
    path = path.substr(0, tmp + 1) + string("STREAM") + getDirSeparator() + string("SSIF") + getDirSeparator();

    const string mplsExt = strToLowerCase(extractFileExt(mplsFileName));
    const string ssifExt = mplsExt == "mpls" ? "ssif" : "sif";

    return path + mplsNum + string(".") + ssifExt;
}